

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O3

void __thiscall MDIOAnalyzer::SetupResults(MDIOAnalyzer *this)

{
  MDIOAnalyzerResults *pMVar1;
  MDIOAnalyzerResults *this_00;
  
  this_00 = (MDIOAnalyzerResults *)operator_new(0x20);
  MDIOAnalyzerResults::MDIOAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  pMVar1 = (this->mResults)._M_ptr;
  if (pMVar1 != this_00) {
    if (pMVar1 != (MDIOAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pMVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void MDIOAnalyzer::SetupResults()
{
    mResults.reset( new MDIOAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mMdioChannel );
}